

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shortcut.cxx
# Opt level: O0

uint Fl_Widget::label_shortcut(char *t)

{
  uint uVar1;
  char *pcStack_18;
  uint s;
  char *t_local;
  
  pcStack_18 = t;
  if (t != (char *)0x0) {
    for (; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1) {
      if (*pcStack_18 == '&') {
        uVar1 = fl_utf8decode(pcStack_18 + 1,(char *)0x0,(wchar_t *)0x0);
        if (uVar1 == 0) {
          return 0;
        }
        if (uVar1 != 0x26) {
          return uVar1;
        }
        pcStack_18 = pcStack_18 + 1;
      }
    }
  }
  return 0;
}

Assistant:

unsigned int Fl_Widget::label_shortcut(const char *t) {
  if (!t) return 0;
  for (;;) {
    if (*t==0) return 0;
    if (*t=='&') {
      unsigned int s = fl_utf8decode(t+1, 0, 0);
      if (s==0) return 0;
      else if (s==(unsigned int)'&') t++;
      else return s;
    }
    t++;
  }
}